

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec08.c
# Opt level: O1

void If_Dec08Verify(word *pF,int nVars,uint *pZ)

{
  long lVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  word *pwVar9;
  word *pG [4];
  word pN [16] [16];
  ulong local_900;
  long alStack_8d8 [4];
  ulong local_8b8 [16];
  word awStack_838 [257];
  
  local_900 = (ulong)(uint)nVars;
  uVar2 = 1 << ((char)nVars - 6U & 0x1f);
  if (nVars < 7) {
    uVar2 = 1;
  }
  uVar7 = (ulong)uVar2;
  if (nVars < 1) {
    local_900 = 0;
  }
  else {
    lVar8 = 0;
    do {
      if (0 < (int)uVar2) {
        memcpy((void *)((long)awStack_838 + lVar8),(void *)((long)Truth10[0] + lVar8),uVar7 * 8);
      }
      lVar8 = lVar8 + 0x80;
    } while (local_900 << 7 != lVar8);
  }
  uVar6 = *pZ;
  if (uVar6 != 0) {
    pwVar9 = awStack_838 + local_900 * 0x10;
    lVar8 = 0;
    do {
      lVar3 = 0;
      do {
        *(ulong *)((long)alStack_8d8 + lVar3 * 2) =
             (long)awStack_838 + (ulong)((uVar6 >> ((char)lVar3 + 0x10U & 0x1f) & 7) << 7);
        lVar3 = lVar3 + 4;
      } while (lVar3 != 0x10);
      if (10 < nVars) {
        __assert_fail("nVars <= 10",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/if/ifDec08.c"
                      ,0x6b,"void If_Dec08ComposeLut4(int, word **, word *, int)");
      }
      if (0 < (int)uVar2) {
        memset(awStack_838 + local_900 * 0x10,0,uVar7 * 8);
      }
      uVar4 = 0;
      do {
        if (((uVar6 & 0xffff) >> (uVar4 & 0x1f) & 1) != 0) {
          if (0 < (int)uVar2) {
            memset(local_8b8,0xff,uVar7 * 8);
          }
          lVar3 = 0;
          do {
            if (0 < (int)uVar2) {
              lVar1 = alStack_8d8[lVar3];
              uVar5 = 0;
              do {
                local_8b8[uVar5] =
                     local_8b8[uVar5] &
                     (*(ulong *)(lVar1 + uVar5 * 8) ^
                     (ulong)((uVar4 >> ((uint)lVar3 & 0x1f) & 1) != 0) - 1);
                uVar5 = uVar5 + 1;
              } while (uVar7 != uVar5);
            }
            lVar3 = lVar3 + 1;
          } while (lVar3 != 4);
          if (0 < (int)uVar2) {
            uVar5 = 0;
            do {
              pwVar9[uVar5] = pwVar9[uVar5] | local_8b8[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar5);
          }
        }
        uVar4 = uVar4 + 1;
      } while (uVar4 != 0x10);
      local_900 = local_900 + 1;
      uVar6 = pZ[lVar8 + 1];
      lVar8 = lVar8 + 1;
      pwVar9 = pwVar9 + 0x10;
    } while (uVar6 != 0);
  }
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      if ((awStack_838 + ((long)(int)local_900 + -1) * 0x10)[uVar5] != pF[uVar5]) {
        If_Dec08PrintConfig(pZ);
        Kit_DsdPrintFromTruth((uint *)pF,nVars);
        putchar(10);
        Kit_DsdPrintFromTruth((uint *)(awStack_838 + ((long)(int)local_900 + -1) * 0x10),nVars);
        putchar(10);
        puts("Verification failed!");
        return;
      }
      uVar5 = uVar5 + 1;
    } while (uVar7 != uVar5);
  }
  return;
}

Assistant:

void If_Dec08Verify( word * pF, int nVars, unsigned * pZ )
{
    word pN[16][16], * pG[4];
    int i, w, v, k, nWords;
    unsigned z;
    nWords = If_Dec08WordNum( nVars );
    for ( k = 0; k < nVars; k++ )
        for ( w = 0; w < nWords; w++ )
            pN[k][w] = Truth10[k][w];
    for ( i = 0; (z = pZ[i]); i++, k++ )
    {
        for ( v = 0; v < 4; v++ )
            pG[v] = pN[ (z >> (16+(v<<2))) & 7 ];
        If_Dec08ComposeLut4( (int)(z & 0xffff), pG, pN[k], nVars );
    }
    k--;
    for ( w = 0; w < nWords; w++ )
        if ( pN[k][w] != pF[w] )
        {
            If_Dec08PrintConfig( pZ );
            Kit_DsdPrintFromTruth( (unsigned*)pF, nVars ); printf( "\n" );
            Kit_DsdPrintFromTruth( (unsigned*)pN[k], nVars ); printf( "\n" );
            printf( "Verification failed!\n" );
            break;
        }
}